

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deCommandLine.cpp
# Opt level: O0

void de::cmdline::selfTest(void)

{
  deBool dVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar2;
  size_type sVar3;
  const_reference pvVar4;
  Parser *pPVar5;
  ValueType *pVVar6;
  ValueType *pVVar7;
  ValueType *pVVar8;
  ValueType *pVVar9;
  ValueType *pVVar10;
  bool bVar11;
  byte local_2745;
  bool local_272d;
  bool local_2715;
  byte local_2709;
  byte local_26fd;
  byte local_26ed;
  byte local_26e1;
  byte local_26d1;
  byte local_26c5;
  byte local_26b5;
  byte local_26a9;
  byte local_2699;
  byte local_268d;
  byte local_267d;
  byte local_2671;
  byte local_2661;
  byte local_2655;
  byte local_2645;
  byte local_2639;
  bool local_2619;
  byte local_25f9;
  byte local_25e5;
  bool local_25c9;
  byte local_25bd;
  byte local_25b1;
  bool local_2595;
  bool local_2579;
  byte local_2559;
  byte local_2545;
  bool local_2529;
  byte local_251d;
  byte local_2511;
  bool local_24f1;
  byte local_24c1;
  bool local_2491;
  byte local_2485;
  byte local_2479;
  bool local_2459;
  byte local_241d;
  byte local_2411;
  byte local_2405;
  byte local_23f9;
  byte local_23e9;
  byte local_23dd;
  bool local_23a1;
  byte local_2382;
  byte local_2381;
  byte local_2371;
  byte local_2365;
  byte local_2355;
  byte local_2349;
  byte local_233a;
  byte local_2339;
  string local_2330 [39];
  byte local_2309;
  undefined1 local_2308 [7];
  bool parseOk_15;
  ostringstream err_16;
  CommandLine cmdLine_15;
  char *args_13 [4];
  string local_2118 [39];
  byte local_20f1;
  undefined1 local_20f0 [7];
  bool parseOk_14;
  ostringstream err_15;
  CommandLine cmdLine_14;
  char *args_12 [1];
  string local_1f20 [39];
  byte local_1ef9;
  undefined1 local_1ef8 [7];
  bool parseOk_13;
  ostringstream err_14;
  CommandLine cmdLine_13;
  char *args_11 [2];
  string local_1d20 [39];
  byte local_1cf9;
  undefined1 local_1cf8 [7];
  bool parseOk_12;
  ostringstream err_13;
  CommandLine cmdLine_12;
  char *args_10 [2];
  string local_1b20 [39];
  byte local_1af9;
  undefined1 local_1af8 [7];
  bool parseOk_11;
  ostringstream err_12;
  CommandLine cmdLine_11;
  char *args_9 [1];
  string local_1928 [39];
  byte local_1901;
  undefined1 local_1900 [7];
  bool parseOk_10;
  ostringstream err_11;
  CommandLine cmdLine_10;
  char *args_8 [1];
  string local_1730 [39];
  byte local_1709;
  undefined1 local_1708 [7];
  bool parseOk_9;
  ostringstream err_10;
  CommandLine cmdLine_9;
  char *args_7 [1];
  string local_1538 [39];
  byte local_1511;
  undefined1 local_1510 [7];
  bool parseOk_8;
  ostringstream err_9;
  CommandLine cmdLine_8;
  char *args_6 [1];
  string local_1340 [39];
  byte local_1319;
  undefined1 local_1318 [7];
  bool parseOk_7;
  ostringstream err_8;
  CommandLine cmdLine_7;
  char *args_5 [4];
  string local_1130 [39];
  byte local_1109;
  undefined1 local_1108 [7];
  bool parseOk_6;
  ostringstream err_7;
  CommandLine cmdLine_6;
  char *args_4 [5];
  string local_f10 [39];
  byte local_ee9;
  undefined1 local_ee8 [7];
  bool parseOk_5;
  ostringstream err_6;
  CommandLine cmdLine_5;
  char *args_3 [5];
  string local_cf8 [39];
  byte local_cd1;
  undefined1 local_cd0 [7];
  bool parseOk_4;
  ostringstream err_5;
  CommandLine cmdLine_4;
  string local_b08 [39];
  byte local_ae1;
  string local_ae0 [32];
  undefined1 local_ac0 [8];
  ostringstream err_4;
  Option<de::cmdline::TestBoolOpt> local_910;
  Option<de::cmdline::TestIntOpt> local_8d8;
  Option<de::cmdline::TestStringDefOpt> local_8a0;
  Option<de::cmdline::TestStringOpt> local_868;
  undefined1 local_830 [8];
  Parser parser_1;
  int ndx;
  byte local_7e9;
  undefined1 local_7e8 [7];
  bool parseOk_3;
  CommandLine cmdLine_3;
  ostringstream err_3;
  char *args_2 [3];
  string local_608 [39];
  byte local_5e1;
  undefined1 local_5e0 [7];
  bool parseOk_2;
  CommandLine cmdLine_2;
  ostringstream err_2;
  char *args_1 [1];
  string local_410 [39];
  byte local_3e9;
  undefined1 local_3e8 [7];
  bool parseOk_1;
  CommandLine cmdLine_1;
  ostringstream err_1;
  char *args [1];
  string local_218 [39];
  byte local_1f1;
  undefined1 local_1f0 [7];
  bool parseOk;
  CommandLine cmdLine;
  undefined1 local_198 [8];
  ostringstream err;
  Parser parser;
  
  detail::Parser::Parser((Parser *)&err.field_0x170);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  detail::CommandLine::CommandLine((CommandLine *)local_1f0);
  local_1f1 = detail::Parser::parse
                        ((Parser *)&err.field_0x170,0,(char **)0x0,(CommandLine *)local_1f0,
                         (ostream *)local_198);
  do {
    bVar11 = false;
    dVar1 = ::deGetFalse();
    local_2339 = 0;
    if (dVar1 == 0) {
      bVar11 = (local_1f1 & 1) != 0;
      local_233a = 0;
      if (bVar11) {
        std::__cxx11::ostringstream::str();
        local_233a = std::__cxx11::string::empty();
      }
      local_2339 = local_233a;
    }
    if (bVar11) {
      std::__cxx11::string::~string(local_218);
    }
    if ((local_2339 & 1) == 0) {
      deAssertFail("parseOk && err.str().empty()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                   ,0x166);
    }
    dVar1 = ::deGetFalse();
  } while (dVar1 != 0);
  detail::CommandLine::~CommandLine((CommandLine *)local_1f0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  err_1._368_8_ = anon_var_dwarf_25d6d46;
  std::__cxx11::ostringstream::ostringstream
            ((ostringstream *)
             &cmdLine_1.m_args.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  detail::CommandLine::CommandLine((CommandLine *)local_3e8);
  local_3e9 = detail::Parser::parse
                        ((Parser *)&err.field_0x170,1,(char **)&err_1.field_0x170,
                         (CommandLine *)local_3e8,
                         (ostream *)
                         &cmdLine_1.m_args.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
  do {
    dVar1 = ::deGetFalse();
    local_2349 = 0;
    if (dVar1 == 0) {
      local_2349 = local_3e9 ^ 0xff;
    }
    if ((local_2349 & 1) == 0) {
      deAssertFail("!parseOk",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                   ,0x16f);
    }
    dVar1 = ::deGetFalse();
  } while (dVar1 != 0);
  do {
    dVar1 = ::deGetFalse();
    local_2355 = 0;
    if (dVar1 == 0) {
      std::__cxx11::ostringstream::str();
      local_2355 = std::__cxx11::string::empty();
    }
    if (dVar1 == 0) {
      std::__cxx11::string::~string(local_410);
    }
    if ((local_2355 & 1) == 0) {
      deAssertFail("err.str().empty()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                   ,0x170);
    }
    dVar1 = ::deGetFalse();
  } while (dVar1 != 0);
  detail::CommandLine::~CommandLine((CommandLine *)local_3e8);
  std::__cxx11::ostringstream::~ostringstream
            ((ostringstream *)
             &cmdLine_1.m_args.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  err_2._368_8_ = (long)"hello/world --help" + 0xc;
  std::__cxx11::ostringstream::ostringstream
            ((ostringstream *)
             &cmdLine_2.m_args.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  detail::CommandLine::CommandLine((CommandLine *)local_5e0);
  local_5e1 = detail::Parser::parse
                        ((Parser *)&err.field_0x170,1,(char **)&err_2.field_0x170,
                         (CommandLine *)local_5e0,
                         (ostream *)
                         &cmdLine_2.m_args.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
  do {
    dVar1 = ::deGetFalse();
    local_2365 = 0;
    if (dVar1 == 0) {
      local_2365 = local_5e1 ^ 0xff;
    }
    if ((local_2365 & 1) == 0) {
      deAssertFail("!parseOk",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                   ,0x179);
    }
    dVar1 = ::deGetFalse();
  } while (dVar1 != 0);
  do {
    dVar1 = ::deGetFalse();
    local_2371 = 0;
    if (dVar1 == 0) {
      std::__cxx11::ostringstream::str();
      local_2371 = std::__cxx11::string::empty();
    }
    if (dVar1 == 0) {
      std::__cxx11::string::~string(local_608);
    }
    if ((local_2371 & 1) == 0) {
      deAssertFail("err.str().empty()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                   ,0x17a);
    }
    dVar1 = ::deGetFalse();
  } while (dVar1 != 0);
  detail::CommandLine::~CommandLine((CommandLine *)local_5e0);
  std::__cxx11::ostringstream::~ostringstream
            ((ostringstream *)
             &cmdLine_2.m_args.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  err_3._368_8_ = (long)"hello/world --help foo" + 0x13;
  std::__cxx11::ostringstream::ostringstream
            ((ostringstream *)
             &cmdLine_3.m_args.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  detail::CommandLine::CommandLine((CommandLine *)local_7e8);
  local_7e9 = detail::Parser::parse
                        ((Parser *)&err.field_0x170,3,(char **)&err_3.field_0x170,
                         (CommandLine *)local_7e8,
                         (ostream *)
                         &cmdLine_3.m_args.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
  do {
    parser_1.m_options.
    super__Vector_base<de::cmdline::detail::Parser::OptInfo,_std::allocator<de::cmdline::detail::Parser::OptInfo>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
    dVar1 = ::deGetFalse();
    local_2381 = 0;
    if (dVar1 == 0) {
      local_2382 = 0;
      if ((local_7e9 & 1) != 0) {
        std::__cxx11::ostringstream::str();
        parser_1.m_options.
        super__Vector_base<de::cmdline::detail::Parser::OptInfo,_std::allocator<de::cmdline::detail::Parser::OptInfo>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
        local_2382 = std::__cxx11::string::empty();
      }
      local_2381 = local_2382;
    }
    if ((parser_1.m_options.
         super__Vector_base<de::cmdline::detail::Parser::OptInfo,_std::allocator<de::cmdline::detail::Parser::OptInfo>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
      std::__cxx11::string::~string((string *)&ndx);
    }
    if ((local_2381 & 1) == 0) {
      deAssertFail("parseOk && err.str().empty()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                   ,0x183);
    }
    dVar1 = ::deGetFalse();
  } while (dVar1 != 0);
  do {
    dVar1 = ::deGetFalse();
    bVar11 = false;
    if (dVar1 == 0) {
      pvVar2 = detail::CommandLine::getArgs_abi_cxx11_((CommandLine *)local_7e8);
      sVar3 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(pvVar2);
      bVar11 = sVar3 == 3;
    }
    if (!bVar11) {
      deAssertFail("cmdLine.getArgs().size() == DE_LENGTH_OF_ARRAY(args)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                   ,0x184);
    }
    dVar1 = ::deGetFalse();
  } while (dVar1 != 0);
  for (parser_1.m_options.
       super__Vector_base<de::cmdline::detail::Parser::OptInfo,_std::allocator<de::cmdline::detail::Parser::OptInfo>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
      (int)parser_1.m_options.
           super__Vector_base<de::cmdline::detail::Parser::OptInfo,_std::allocator<de::cmdline::detail::Parser::OptInfo>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage < 3;
      parser_1.m_options.
      super__Vector_base<de::cmdline::detail::Parser::OptInfo,_std::allocator<de::cmdline::detail::Parser::OptInfo>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
           (int)parser_1.m_options.
                super__Vector_base<de::cmdline::detail::Parser::OptInfo,_std::allocator<de::cmdline::detail::Parser::OptInfo>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) {
    do {
      dVar1 = ::deGetFalse();
      local_23a1 = false;
      if (dVar1 == 0) {
        pvVar2 = detail::CommandLine::getArgs_abi_cxx11_((CommandLine *)local_7e8);
        pvVar4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](pvVar2,(long)(int)parser_1.m_options.
                                                super__Vector_base<de::cmdline::detail::Parser::OptInfo,_std::allocator<de::cmdline::detail::Parser::OptInfo>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
        local_23a1 = std::operator==(pvVar4,args_2[(long)(int)parser_1.m_options.
                                                                                                                            
                                                  super__Vector_base<de::cmdline::detail::Parser::OptInfo,_std::allocator<de::cmdline::detail::Parser::OptInfo>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  + -1]);
      }
      if (local_23a1 == false) {
        deAssertFail("cmdLine.getArgs()[ndx] == args[ndx]",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                     ,0x187);
      }
      dVar1 = ::deGetFalse();
    } while (dVar1 != 0);
  }
  detail::CommandLine::~CommandLine((CommandLine *)local_7e8);
  std::__cxx11::ostringstream::~ostringstream
            ((ostringstream *)
             &cmdLine_3.m_args.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  detail::Parser::~Parser((Parser *)&err.field_0x170);
  detail::Parser::Parser((Parser *)local_830);
  Option<de::cmdline::TestStringOpt>::Option(&local_868,"s","string","String option",(char *)0x0);
  pPVar5 = detail::operator<<((Parser *)local_830,&local_868);
  Option<de::cmdline::TestStringDefOpt>::Option
            (&local_8a0,"x","xyz","String option w/ default value","foo");
  pPVar5 = detail::operator<<(pPVar5,&local_8a0);
  Option<de::cmdline::TestIntOpt>::Option(&local_8d8,"i","int","Int option",(char *)0x0);
  pPVar5 = detail::operator<<(pPVar5,&local_8d8);
  Option<de::cmdline::TestBoolOpt>::Option(&local_910,"b","bool","Test boolean flag",(char *)0x0);
  pPVar5 = detail::operator<<(pPVar5,&local_910);
  Option<de::cmdline::TestNamedOpt>::Option
            ((Option<de::cmdline::TestNamedOpt> *)&err_4.field_0x170,"n","named","Test named opt",
             selfTest::s_namedValues,
             (NamedValue<unsigned_long> *)&PTR_anon_var_dwarf_25d863a_032ecf40,"one");
  detail::operator<<(pPVar5,(Option<de::cmdline::TestNamedOpt> *)&err_4.field_0x170);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_ac0);
  do {
    local_ae1 = 0;
    dVar1 = ::deGetFalse();
    local_23dd = 0;
    if (dVar1 == 0) {
      std::__cxx11::ostringstream::str();
      local_ae1 = 1;
      local_23dd = std::__cxx11::string::empty();
    }
    if ((local_ae1 & 1) != 0) {
      std::__cxx11::string::~string(local_ae0);
    }
    if ((local_23dd & 1) == 0) {
      deAssertFail("err.str().empty()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                   ,0x19e);
    }
    dVar1 = ::deGetFalse();
  } while (dVar1 != 0);
  detail::Parser::help((Parser *)local_830,(ostream *)local_ac0);
  do {
    dVar1 = ::deGetFalse();
    local_23e9 = 0;
    if (dVar1 == 0) {
      std::__cxx11::ostringstream::str();
      local_23e9 = std::__cxx11::string::empty();
      local_23e9 = local_23e9 ^ 0xff;
    }
    if (dVar1 == 0) {
      std::__cxx11::string::~string(local_b08);
    }
    if ((local_23e9 & 1) == 0) {
      deAssertFail("!err.str().empty()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                   ,0x1a0);
    }
    dVar1 = ::deGetFalse();
  } while (dVar1 != 0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_ac0);
  detail::CommandLine::CommandLine((CommandLine *)&err_5.field_0x170);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_cd0);
  local_cd1 = detail::Parser::parse
                        ((Parser *)local_830,0,(char **)0x0,(CommandLine *)&err_5.field_0x170,
                         (ostream *)local_cd0);
  do {
    dVar1 = ::deGetFalse();
    local_23f9 = 0;
    if (dVar1 == 0) {
      local_23f9 = local_cd1;
    }
    if ((local_23f9 & 1) == 0) {
      deAssertFail("parseOk",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                   ,0x1a9);
    }
    dVar1 = ::deGetFalse();
  } while (dVar1 != 0);
  do {
    dVar1 = ::deGetFalse();
    local_2405 = 0;
    if (dVar1 == 0) {
      std::__cxx11::ostringstream::str();
      local_2405 = std::__cxx11::string::empty();
    }
    if (dVar1 == 0) {
      std::__cxx11::string::~string(local_cf8);
    }
    if ((local_2405 & 1) == 0) {
      deAssertFail("err.str().empty()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                   ,0x1aa);
    }
    dVar1 = ::deGetFalse();
  } while (dVar1 != 0);
  do {
    dVar1 = ::deGetFalse();
    local_2411 = 0;
    if (dVar1 == 0) {
      bVar11 = detail::CommandLine::hasOption<de::cmdline::TestStringOpt>
                         ((CommandLine *)&err_5.field_0x170);
      local_2411 = bVar11 ^ 0xff;
    }
    if ((local_2411 & 1) == 0) {
      deAssertFail("!cmdLine.hasOption<TestStringOpt>()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                   ,0x1ac);
    }
    dVar1 = ::deGetFalse();
  } while (dVar1 != 0);
  do {
    dVar1 = ::deGetFalse();
    local_241d = 0;
    if (dVar1 == 0) {
      bVar11 = detail::CommandLine::hasOption<de::cmdline::TestIntOpt>
                         ((CommandLine *)&err_5.field_0x170);
      local_241d = bVar11 ^ 0xff;
    }
    if ((local_241d & 1) == 0) {
      deAssertFail("!cmdLine.hasOption<TestIntOpt>()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                   ,0x1ad);
    }
    dVar1 = ::deGetFalse();
  } while (dVar1 != 0);
  do {
    dVar1 = ::deGetFalse();
    bVar11 = false;
    if (dVar1 == 0) {
      pVVar6 = detail::CommandLine::getOption<de::cmdline::TestNamedOpt>
                         ((CommandLine *)&err_5.field_0x170);
      bVar11 = *pVVar6 == 1;
    }
    if (!bVar11) {
      deAssertFail("cmdLine.getOption<TestNamedOpt>() == 1",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                   ,0x1ae);
    }
    dVar1 = ::deGetFalse();
  } while (dVar1 != 0);
  do {
    dVar1 = ::deGetFalse();
    bVar11 = false;
    if (dVar1 == 0) {
      pVVar7 = detail::CommandLine::getOption<de::cmdline::TestBoolOpt>
                         ((CommandLine *)&err_5.field_0x170);
      bVar11 = (*pVVar7 & 1U) == 0;
    }
    if (!bVar11) {
      deAssertFail("cmdLine.getOption<TestBoolOpt>() == false",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                   ,0x1af);
    }
    dVar1 = ::deGetFalse();
  } while (dVar1 != 0);
  do {
    dVar1 = ::deGetFalse();
    local_2459 = false;
    if (dVar1 == 0) {
      pVVar8 = detail::CommandLine::getOption<de::cmdline::TestStringDefOpt>
                         ((CommandLine *)&err_5.field_0x170);
      local_2459 = std::operator==(pVVar8,"foo");
    }
    if (local_2459 == false) {
      deAssertFail("cmdLine.getOption<TestStringDefOpt>() == \"foo\"",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                   ,0x1b0);
    }
    dVar1 = ::deGetFalse();
  } while (dVar1 != 0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_cd0);
  detail::CommandLine::~CommandLine((CommandLine *)&err_5.field_0x170);
  cmdLine_5.m_args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)anon_var_dwarf_25d863a;
  detail::CommandLine::CommandLine((CommandLine *)&err_6.field_0x170);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_ee8);
  local_ee9 = detail::Parser::parse
                        ((Parser *)local_830,5,
                         (char **)&cmdLine_5.m_args.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                         (CommandLine *)&err_6.field_0x170,(ostream *)local_ee8);
  do {
    dVar1 = ::deGetFalse();
    local_2479 = 0;
    if (dVar1 == 0) {
      local_2479 = local_ee9;
    }
    if ((local_2479 & 1) == 0) {
      deAssertFail("parseOk",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                   ,0x1ba);
    }
    dVar1 = ::deGetFalse();
  } while (dVar1 != 0);
  do {
    dVar1 = ::deGetFalse();
    local_2485 = 0;
    if (dVar1 == 0) {
      std::__cxx11::ostringstream::str();
      local_2485 = std::__cxx11::string::empty();
    }
    if (dVar1 == 0) {
      std::__cxx11::string::~string(local_f10);
    }
    if ((local_2485 & 1) == 0) {
      deAssertFail("err.str().empty()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                   ,0x1bb);
    }
    dVar1 = ::deGetFalse();
  } while (dVar1 != 0);
  do {
    dVar1 = ::deGetFalse();
    local_2491 = false;
    if (dVar1 == 0) {
      pVVar9 = detail::CommandLine::getOption<de::cmdline::TestStringOpt>
                         ((CommandLine *)&err_6.field_0x170);
      local_2491 = std::operator==(pVVar9,"test value");
    }
    if (local_2491 == false) {
      deAssertFail("cmdLine.getOption<TestStringOpt>() == \"test value\"",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                   ,0x1bd);
    }
    dVar1 = ::deGetFalse();
  } while (dVar1 != 0);
  do {
    dVar1 = ::deGetFalse();
    bVar11 = false;
    if (dVar1 == 0) {
      pVVar10 = detail::CommandLine::getOption<de::cmdline::TestIntOpt>
                          ((CommandLine *)&err_6.field_0x170);
      bVar11 = *pVVar10 == 9;
    }
    if (!bVar11) {
      deAssertFail("cmdLine.getOption<TestIntOpt>() == 9",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                   ,0x1be);
    }
    dVar1 = ::deGetFalse();
  } while (dVar1 != 0);
  do {
    dVar1 = ::deGetFalse();
    local_24c1 = 0;
    if (dVar1 == 0) {
      pVVar7 = detail::CommandLine::getOption<de::cmdline::TestBoolOpt>
                         ((CommandLine *)&err_6.field_0x170);
      local_24c1 = *pVVar7;
    }
    if ((local_24c1 & 1) == 0) {
      deAssertFail("cmdLine.getOption<TestBoolOpt>()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                   ,0x1bf);
    }
    dVar1 = ::deGetFalse();
  } while (dVar1 != 0);
  do {
    dVar1 = ::deGetFalse();
    bVar11 = false;
    if (dVar1 == 0) {
      pVVar6 = detail::CommandLine::getOption<de::cmdline::TestNamedOpt>
                         ((CommandLine *)&err_6.field_0x170);
      bVar11 = *pVVar6 == 0xffffffffffffffff;
    }
    if (!bVar11) {
      deAssertFail("cmdLine.getOption<TestNamedOpt>() == ~0ull",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                   ,0x1c0);
    }
    dVar1 = ::deGetFalse();
  } while (dVar1 != 0);
  do {
    dVar1 = ::deGetFalse();
    local_24f1 = false;
    if (dVar1 == 0) {
      pVVar8 = detail::CommandLine::getOption<de::cmdline::TestStringDefOpt>
                         ((CommandLine *)&err_6.field_0x170);
      local_24f1 = std::operator==(pVVar8,"foo");
    }
    if (local_24f1 == false) {
      deAssertFail("cmdLine.getOption<TestStringDefOpt>() == \"foo\"",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                   ,0x1c1);
    }
    dVar1 = ::deGetFalse();
  } while (dVar1 != 0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_ee8);
  detail::CommandLine::~CommandLine((CommandLine *)&err_6.field_0x170);
  cmdLine_6.m_args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)anon_var_dwarf_25d86c1;
  detail::CommandLine::CommandLine((CommandLine *)&err_7.field_0x170);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1108);
  local_1109 = detail::Parser::parse
                         ((Parser *)local_830,5,
                          (char **)&cmdLine_6.m_args.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          (CommandLine *)&err_7.field_0x170,(ostream *)local_1108);
  do {
    dVar1 = ::deGetFalse();
    local_2511 = 0;
    if (dVar1 == 0) {
      local_2511 = local_1109;
    }
    if ((local_2511 & 1) == 0) {
      deAssertFail("parseOk",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                   ,0x1cb);
    }
    dVar1 = ::deGetFalse();
  } while (dVar1 != 0);
  do {
    dVar1 = ::deGetFalse();
    local_251d = 0;
    if (dVar1 == 0) {
      std::__cxx11::ostringstream::str();
      local_251d = std::__cxx11::string::empty();
    }
    if (dVar1 == 0) {
      std::__cxx11::string::~string(local_1130);
    }
    if ((local_251d & 1) == 0) {
      deAssertFail("err.str().empty()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                   ,0x1cc);
    }
    dVar1 = ::deGetFalse();
  } while (dVar1 != 0);
  do {
    dVar1 = ::deGetFalse();
    local_2529 = false;
    if (dVar1 == 0) {
      pVVar9 = detail::CommandLine::getOption<de::cmdline::TestStringOpt>
                         ((CommandLine *)&err_7.field_0x170);
      local_2529 = std::operator==(pVVar9,"foo");
    }
    if (local_2529 == false) {
      deAssertFail("cmdLine.getOption<TestStringOpt>() == \"foo\"",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                   ,0x1ce);
    }
    dVar1 = ::deGetFalse();
  } while (dVar1 != 0);
  do {
    dVar1 = ::deGetFalse();
    local_2545 = 0;
    if (dVar1 == 0) {
      pVVar7 = detail::CommandLine::getOption<de::cmdline::TestBoolOpt>
                         ((CommandLine *)&err_7.field_0x170);
      local_2545 = *pVVar7;
    }
    if ((local_2545 & 1) == 0) {
      deAssertFail("cmdLine.getOption<TestBoolOpt>()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                   ,0x1cf);
    }
    dVar1 = ::deGetFalse();
  } while (dVar1 != 0);
  do {
    dVar1 = ::deGetFalse();
    local_2559 = 0;
    if (dVar1 == 0) {
      bVar11 = detail::CommandLine::hasOption<de::cmdline::TestIntOpt>
                         ((CommandLine *)&err_7.field_0x170);
      local_2559 = bVar11 ^ 0xff;
    }
    if ((local_2559 & 1) == 0) {
      deAssertFail("!cmdLine.hasOption<TestIntOpt>()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                   ,0x1d0);
    }
    dVar1 = ::deGetFalse();
  } while (dVar1 != 0);
  do {
    dVar1 = ::deGetFalse();
    bVar11 = false;
    if (dVar1 == 0) {
      pvVar2 = detail::CommandLine::getArgs_abi_cxx11_((CommandLine *)&err_7.field_0x170);
      sVar3 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(pvVar2);
      bVar11 = sVar3 == 2;
    }
    if (!bVar11) {
      deAssertFail("cmdLine.getArgs().size() == 2",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                   ,0x1d2);
    }
    dVar1 = ::deGetFalse();
  } while (dVar1 != 0);
  do {
    dVar1 = ::deGetFalse();
    local_2579 = false;
    if (dVar1 == 0) {
      pvVar2 = detail::CommandLine::getArgs_abi_cxx11_((CommandLine *)&err_7.field_0x170);
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](pvVar2,0);
      local_2579 = std::operator==(pvVar4,"--int=2");
    }
    if (local_2579 == false) {
      deAssertFail("cmdLine.getArgs()[0] == \"--int=2\"",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                   ,0x1d3);
    }
    dVar1 = ::deGetFalse();
  } while (dVar1 != 0);
  do {
    dVar1 = ::deGetFalse();
    local_2595 = false;
    if (dVar1 == 0) {
      pvVar2 = detail::CommandLine::getArgs_abi_cxx11_((CommandLine *)&err_7.field_0x170);
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](pvVar2,1);
      local_2595 = std::operator==(pvVar4,"-b");
    }
    if (local_2595 == false) {
      deAssertFail("cmdLine.getArgs()[1] == \"-b\"",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                   ,0x1d4);
    }
    dVar1 = ::deGetFalse();
  } while (dVar1 != 0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1108);
  detail::CommandLine::~CommandLine((CommandLine *)&err_7.field_0x170);
  cmdLine_7.m_args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)anon_var_dwarf_25d8727;
  detail::CommandLine::CommandLine((CommandLine *)&err_8.field_0x170);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1318);
  local_1319 = detail::Parser::parse
                         ((Parser *)local_830,4,
                          (char **)&cmdLine_7.m_args.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          (CommandLine *)&err_8.field_0x170,(ostream *)local_1318);
  do {
    dVar1 = ::deGetFalse();
    local_25b1 = 0;
    if (dVar1 == 0) {
      local_25b1 = local_1319;
    }
    if ((local_25b1 & 1) == 0) {
      deAssertFail("parseOk",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                   ,0x1de);
    }
    dVar1 = ::deGetFalse();
  } while (dVar1 != 0);
  do {
    dVar1 = ::deGetFalse();
    local_25bd = 0;
    if (dVar1 == 0) {
      std::__cxx11::ostringstream::str();
      local_25bd = std::__cxx11::string::empty();
    }
    if (dVar1 == 0) {
      std::__cxx11::string::~string(local_1340);
    }
    if ((local_25bd & 1) == 0) {
      deAssertFail("err.str().empty()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                   ,0x1df);
    }
    dVar1 = ::deGetFalse();
  } while (dVar1 != 0);
  do {
    dVar1 = ::deGetFalse();
    local_25c9 = false;
    if (dVar1 == 0) {
      pVVar9 = detail::CommandLine::getOption<de::cmdline::TestStringOpt>
                         ((CommandLine *)&err_8.field_0x170);
      local_25c9 = std::operator==(pVVar9,"--");
    }
    if (local_25c9 == false) {
      deAssertFail("cmdLine.getOption<TestStringOpt>() == \"--\"",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                   ,0x1e1);
    }
    dVar1 = ::deGetFalse();
  } while (dVar1 != 0);
  do {
    dVar1 = ::deGetFalse();
    local_25e5 = 0;
    if (dVar1 == 0) {
      pVVar7 = detail::CommandLine::getOption<de::cmdline::TestBoolOpt>
                         ((CommandLine *)&err_8.field_0x170);
      local_25e5 = *pVVar7;
    }
    if ((local_25e5 & 1) == 0) {
      deAssertFail("cmdLine.getOption<TestBoolOpt>()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                   ,0x1e2);
    }
    dVar1 = ::deGetFalse();
  } while (dVar1 != 0);
  do {
    dVar1 = ::deGetFalse();
    local_25f9 = 0;
    if (dVar1 == 0) {
      bVar11 = detail::CommandLine::hasOption<de::cmdline::TestIntOpt>
                         ((CommandLine *)&err_8.field_0x170);
      local_25f9 = bVar11 ^ 0xff;
    }
    if ((local_25f9 & 1) == 0) {
      deAssertFail("!cmdLine.hasOption<TestIntOpt>()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                   ,0x1e3);
    }
    dVar1 = ::deGetFalse();
  } while (dVar1 != 0);
  do {
    dVar1 = ::deGetFalse();
    bVar11 = false;
    if (dVar1 == 0) {
      pvVar2 = detail::CommandLine::getArgs_abi_cxx11_((CommandLine *)&err_8.field_0x170);
      sVar3 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(pvVar2);
      bVar11 = sVar3 == 1;
    }
    if (!bVar11) {
      deAssertFail("cmdLine.getArgs().size() == 1",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                   ,0x1e5);
    }
    dVar1 = ::deGetFalse();
  } while (dVar1 != 0);
  do {
    dVar1 = ::deGetFalse();
    local_2619 = false;
    if (dVar1 == 0) {
      pvVar2 = detail::CommandLine::getArgs_abi_cxx11_((CommandLine *)&err_8.field_0x170);
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](pvVar2,0);
      local_2619 = std::operator==(pvVar4,"foo");
    }
    if (local_2619 == false) {
      deAssertFail("cmdLine.getArgs()[0] == \"foo\"",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                   ,0x1e6);
    }
    dVar1 = ::deGetFalse();
  } while (dVar1 != 0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1318);
  detail::CommandLine::~CommandLine((CommandLine *)&err_8.field_0x170);
  cmdLine_8.m_args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)anon_var_dwarf_25d8753;
  detail::CommandLine::CommandLine((CommandLine *)&err_9.field_0x170);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1510);
  local_1511 = detail::Parser::parse
                         ((Parser *)local_830,1,
                          (char **)&cmdLine_8.m_args.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          (CommandLine *)&err_9.field_0x170,(ostream *)local_1510);
  do {
    dVar1 = ::deGetFalse();
    local_2639 = 0;
    if (dVar1 == 0) {
      local_2639 = local_1511 ^ 0xff;
    }
    if ((local_2639 & 1) == 0) {
      deAssertFail("!parseOk",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                   ,0x1f0);
    }
    dVar1 = ::deGetFalse();
  } while (dVar1 != 0);
  do {
    dVar1 = ::deGetFalse();
    local_2645 = 0;
    if (dVar1 == 0) {
      std::__cxx11::ostringstream::str();
      local_2645 = std::__cxx11::string::empty();
      local_2645 = local_2645 ^ 0xff;
    }
    if (dVar1 == 0) {
      std::__cxx11::string::~string(local_1538);
    }
    if ((local_2645 & 1) == 0) {
      deAssertFail("!err.str().empty()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                   ,0x1f1);
    }
    dVar1 = ::deGetFalse();
  } while (dVar1 != 0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1510);
  detail::CommandLine::~CommandLine((CommandLine *)&err_9.field_0x170);
  cmdLine_9.m_args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)anon_var_dwarf_25d875e;
  detail::CommandLine::CommandLine((CommandLine *)&err_10.field_0x170);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1708);
  local_1709 = detail::Parser::parse
                         ((Parser *)local_830,1,
                          (char **)&cmdLine_9.m_args.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          (CommandLine *)&err_10.field_0x170,(ostream *)local_1708);
  do {
    dVar1 = ::deGetFalse();
    local_2655 = 0;
    if (dVar1 == 0) {
      local_2655 = local_1709 ^ 0xff;
    }
    if ((local_2655 & 1) == 0) {
      deAssertFail("!parseOk",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                   ,0x1fb);
    }
    dVar1 = ::deGetFalse();
  } while (dVar1 != 0);
  do {
    dVar1 = ::deGetFalse();
    local_2661 = 0;
    if (dVar1 == 0) {
      std::__cxx11::ostringstream::str();
      local_2661 = std::__cxx11::string::empty();
      local_2661 = local_2661 ^ 0xff;
    }
    if (dVar1 == 0) {
      std::__cxx11::string::~string(local_1730);
    }
    if ((local_2661 & 1) == 0) {
      deAssertFail("!err.str().empty()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                   ,0x1fc);
    }
    dVar1 = ::deGetFalse();
  } while (dVar1 != 0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1708);
  detail::CommandLine::~CommandLine((CommandLine *)&err_10.field_0x170);
  cmdLine_10.m_args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)anon_var_dwarf_25d8769;
  detail::CommandLine::CommandLine((CommandLine *)&err_11.field_0x170);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1900);
  local_1901 = detail::Parser::parse
                         ((Parser *)local_830,1,
                          (char **)&cmdLine_10.m_args.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          (CommandLine *)&err_11.field_0x170,(ostream *)local_1900);
  do {
    dVar1 = ::deGetFalse();
    local_2671 = 0;
    if (dVar1 == 0) {
      local_2671 = local_1901 ^ 0xff;
    }
    if ((local_2671 & 1) == 0) {
      deAssertFail("!parseOk",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                   ,0x206);
    }
    dVar1 = ::deGetFalse();
  } while (dVar1 != 0);
  do {
    dVar1 = ::deGetFalse();
    local_267d = 0;
    if (dVar1 == 0) {
      std::__cxx11::ostringstream::str();
      local_267d = std::__cxx11::string::empty();
      local_267d = local_267d ^ 0xff;
    }
    if (dVar1 == 0) {
      std::__cxx11::string::~string(local_1928);
    }
    if ((local_267d & 1) == 0) {
      deAssertFail("!err.str().empty()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                   ,0x207);
    }
    dVar1 = ::deGetFalse();
  } while (dVar1 != 0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1900);
  detail::CommandLine::~CommandLine((CommandLine *)&err_11.field_0x170);
  cmdLine_11.m_args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)anon_var_dwarf_25d8774;
  detail::CommandLine::CommandLine((CommandLine *)&err_12.field_0x170);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1af8);
  local_1af9 = detail::Parser::parse
                         ((Parser *)local_830,1,
                          (char **)&cmdLine_11.m_args.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          (CommandLine *)&err_12.field_0x170,(ostream *)local_1af8);
  do {
    dVar1 = ::deGetFalse();
    local_268d = 0;
    if (dVar1 == 0) {
      local_268d = local_1af9 ^ 0xff;
    }
    if ((local_268d & 1) == 0) {
      deAssertFail("!parseOk",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                   ,0x211);
    }
    dVar1 = ::deGetFalse();
  } while (dVar1 != 0);
  do {
    dVar1 = ::deGetFalse();
    local_2699 = 0;
    if (dVar1 == 0) {
      std::__cxx11::ostringstream::str();
      local_2699 = std::__cxx11::string::empty();
      local_2699 = local_2699 ^ 0xff;
    }
    if (dVar1 == 0) {
      std::__cxx11::string::~string(local_1b20);
    }
    if ((local_2699 & 1) == 0) {
      deAssertFail("!err.str().empty()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                   ,0x212);
    }
    dVar1 = ::deGetFalse();
  } while (dVar1 != 0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1af8);
  detail::CommandLine::~CommandLine((CommandLine *)&err_12.field_0x170);
  cmdLine_12.m_args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)anon_var_dwarf_25d877f;
  detail::CommandLine::CommandLine((CommandLine *)&err_13.field_0x170);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1cf8);
  local_1cf9 = detail::Parser::parse
                         ((Parser *)local_830,2,
                          (char **)&cmdLine_12.m_args.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          (CommandLine *)&err_13.field_0x170,(ostream *)local_1cf8);
  do {
    dVar1 = ::deGetFalse();
    local_26a9 = 0;
    if (dVar1 == 0) {
      local_26a9 = local_1cf9 ^ 0xff;
    }
    if ((local_26a9 & 1) == 0) {
      deAssertFail("!parseOk",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                   ,0x21c);
    }
    dVar1 = ::deGetFalse();
  } while (dVar1 != 0);
  do {
    dVar1 = ::deGetFalse();
    local_26b5 = 0;
    if (dVar1 == 0) {
      std::__cxx11::ostringstream::str();
      local_26b5 = std::__cxx11::string::empty();
      local_26b5 = local_26b5 ^ 0xff;
    }
    if (dVar1 == 0) {
      std::__cxx11::string::~string(local_1d20);
    }
    if ((local_26b5 & 1) == 0) {
      deAssertFail("!err.str().empty()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                   ,0x21d);
    }
    dVar1 = ::deGetFalse();
  } while (dVar1 != 0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1cf8);
  detail::CommandLine::~CommandLine((CommandLine *)&err_13.field_0x170);
  cmdLine_13.m_args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)anon_var_dwarf_25d8795;
  detail::CommandLine::CommandLine((CommandLine *)&err_14.field_0x170);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1ef8);
  local_1ef9 = detail::Parser::parse
                         ((Parser *)local_830,2,
                          (char **)&cmdLine_13.m_args.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          (CommandLine *)&err_14.field_0x170,(ostream *)local_1ef8);
  do {
    dVar1 = ::deGetFalse();
    local_26c5 = 0;
    if (dVar1 == 0) {
      local_26c5 = local_1ef9 ^ 0xff;
    }
    if ((local_26c5 & 1) == 0) {
      deAssertFail("!parseOk",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                   ,0x227);
    }
    dVar1 = ::deGetFalse();
  } while (dVar1 != 0);
  do {
    dVar1 = ::deGetFalse();
    local_26d1 = 0;
    if (dVar1 == 0) {
      std::__cxx11::ostringstream::str();
      local_26d1 = std::__cxx11::string::empty();
      local_26d1 = local_26d1 ^ 0xff;
    }
    if (dVar1 == 0) {
      std::__cxx11::string::~string(local_1f20);
    }
    if ((local_26d1 & 1) == 0) {
      deAssertFail("!err.str().empty()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                   ,0x228);
    }
    dVar1 = ::deGetFalse();
  } while (dVar1 != 0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1ef8);
  detail::CommandLine::~CommandLine((CommandLine *)&err_14.field_0x170);
  cmdLine_14.m_args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)anon_var_dwarf_25d877f;
  detail::CommandLine::CommandLine((CommandLine *)&err_15.field_0x170);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_20f0);
  local_20f1 = detail::Parser::parse
                         ((Parser *)local_830,1,
                          (char **)&cmdLine_14.m_args.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          (CommandLine *)&err_15.field_0x170,(ostream *)local_20f0);
  do {
    dVar1 = ::deGetFalse();
    local_26e1 = 0;
    if (dVar1 == 0) {
      local_26e1 = local_20f1 ^ 0xff;
    }
    if ((local_26e1 & 1) == 0) {
      deAssertFail("!parseOk",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                   ,0x232);
    }
    dVar1 = ::deGetFalse();
  } while (dVar1 != 0);
  do {
    dVar1 = ::deGetFalse();
    local_26ed = 0;
    if (dVar1 == 0) {
      std::__cxx11::ostringstream::str();
      local_26ed = std::__cxx11::string::empty();
      local_26ed = local_26ed ^ 0xff;
    }
    if (dVar1 == 0) {
      std::__cxx11::string::~string(local_2118);
    }
    if ((local_26ed & 1) == 0) {
      deAssertFail("!err.str().empty()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                   ,0x233);
    }
    dVar1 = ::deGetFalse();
  } while (dVar1 != 0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_20f0);
  detail::CommandLine::~CommandLine((CommandLine *)&err_15.field_0x170);
  cmdLine_15.m_args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)anon_var_dwarf_25d87ab;
  detail::CommandLine::CommandLine((CommandLine *)&err_16.field_0x170);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2308);
  local_2309 = detail::Parser::parse
                         ((Parser *)local_830,4,
                          (char **)&cmdLine_15.m_args.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          (CommandLine *)&err_16.field_0x170,(ostream *)local_2308);
  do {
    dVar1 = ::deGetFalse();
    local_26fd = 0;
    if (dVar1 == 0) {
      local_26fd = local_2309;
    }
    if ((local_26fd & 1) == 0) {
      deAssertFail("parseOk",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                   ,0x23d);
    }
    dVar1 = ::deGetFalse();
  } while (dVar1 != 0);
  do {
    dVar1 = ::deGetFalse();
    local_2709 = 0;
    if (dVar1 == 0) {
      std::__cxx11::ostringstream::str();
      local_2709 = std::__cxx11::string::empty();
    }
    if (dVar1 == 0) {
      std::__cxx11::string::~string(local_2330);
    }
    if ((local_2709 & 1) == 0) {
      deAssertFail("err.str().empty()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                   ,0x23e);
    }
    dVar1 = ::deGetFalse();
  } while (dVar1 != 0);
  do {
    dVar1 = ::deGetFalse();
    local_2715 = false;
    if (dVar1 == 0) {
      pVVar9 = detail::CommandLine::getOption<de::cmdline::TestStringOpt>
                         ((CommandLine *)&err_16.field_0x170);
      local_2715 = std::operator==(pVVar9,"");
    }
    if (local_2715 == false) {
      deAssertFail("cmdLine.getOption<TestStringOpt>() == \"\"",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                   ,0x23f);
    }
    dVar1 = ::deGetFalse();
  } while (dVar1 != 0);
  do {
    dVar1 = ::deGetFalse();
    local_272d = false;
    if (dVar1 == 0) {
      pVVar8 = detail::CommandLine::getOption<de::cmdline::TestStringDefOpt>
                         ((CommandLine *)&err_16.field_0x170);
      local_272d = std::operator==(pVVar8,"");
    }
    if (local_272d == false) {
      deAssertFail("cmdLine.getOption<TestStringDefOpt>() == \"\"",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                   ,0x240);
    }
    dVar1 = ::deGetFalse();
  } while (dVar1 != 0);
  do {
    dVar1 = ::deGetFalse();
    local_2745 = 0;
    if (dVar1 == 0) {
      pVVar7 = detail::CommandLine::getOption<de::cmdline::TestBoolOpt>
                         ((CommandLine *)&err_16.field_0x170);
      local_2745 = *pVVar7;
    }
    if ((local_2745 & 1) == 0) {
      deAssertFail("cmdLine.getOption<TestBoolOpt>()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deCommandLine.cpp"
                   ,0x241);
    }
    dVar1 = ::deGetFalse();
  } while (dVar1 != 0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2308);
  detail::CommandLine::~CommandLine((CommandLine *)&err_16.field_0x170);
  detail::Parser::~Parser((Parser *)local_830);
  return;
}

Assistant:

void selfTest (void)
{
	// Parsing with no options.
	{
		Parser parser;

		{
			std::ostringstream	err;
			CommandLine			cmdLine;
			const bool			parseOk		= parser.parse(0, DE_NULL, &cmdLine, err);

			DE_TEST_ASSERT(parseOk && err.str().empty());
		}

		{
			const char*			args[]		= { "-h" };
			std::ostringstream	err;
			CommandLine			cmdLine;
			const bool			parseOk		= parser.parse(DE_LENGTH_OF_ARRAY(args), &args[0], &cmdLine, err);

			DE_TEST_ASSERT(!parseOk);
			DE_TEST_ASSERT(err.str().empty()); // No message about -h
		}

		{
			const char*			args[]		= { "--help" };
			std::ostringstream	err;
			CommandLine			cmdLine;
			const bool			parseOk		= parser.parse(DE_LENGTH_OF_ARRAY(args), &args[0], &cmdLine, err);

			DE_TEST_ASSERT(!parseOk);
			DE_TEST_ASSERT(err.str().empty()); // No message about -h
		}

		{
			const char*			args[]		= { "foo", "bar", "baz baz" };
			std::ostringstream	err;
			CommandLine			cmdLine;
			const bool			parseOk		= parser.parse(DE_LENGTH_OF_ARRAY(args), &args[0], &cmdLine, err);

			DE_TEST_ASSERT(parseOk && err.str().empty());
			DE_TEST_ASSERT(cmdLine.getArgs().size() == DE_LENGTH_OF_ARRAY(args));

			for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(args); ndx++)
				DE_TEST_ASSERT(cmdLine.getArgs()[ndx] == args[ndx]);
		}
	}

	// Parsing with options.
	{
		Parser parser;

		static const NamedValue<deUint64> s_namedValues[] =
		{
			{ "zero",	0		},
			{ "one",	1		},
			{ "huge",	~0ull	}
		};

		parser << Option<TestStringOpt>		("s",	"string",	"String option")
			   << Option<TestStringDefOpt>	("x",	"xyz",		"String option w/ default value",	"foo")
			   << Option<TestIntOpt>		("i",	"int",		"Int option")
			   << Option<TestBoolOpt>		("b",	"bool",		"Test boolean flag")
			   << Option<TestNamedOpt>		("n",	"named",	"Test named opt",	DE_ARRAY_BEGIN(s_namedValues),	DE_ARRAY_END(s_namedValues),	"one");

		{
			std::ostringstream err;
			DE_TEST_ASSERT(err.str().empty());
			parser.help(err);
			DE_TEST_ASSERT(!err.str().empty());
		}

		// Default values
		{
			CommandLine			cmdLine;
			std::ostringstream	err;
			bool				parseOk	= parser.parse(0, DE_NULL, &cmdLine, err);

			DE_TEST_ASSERT(parseOk);
			DE_TEST_ASSERT(err.str().empty());

			DE_TEST_ASSERT(!cmdLine.hasOption<TestStringOpt>());
			DE_TEST_ASSERT(!cmdLine.hasOption<TestIntOpt>());
			DE_TEST_ASSERT(cmdLine.getOption<TestNamedOpt>() == 1);
			DE_TEST_ASSERT(cmdLine.getOption<TestBoolOpt>() == false);
			DE_TEST_ASSERT(cmdLine.getOption<TestStringDefOpt>() == "foo");
		}

		// Basic parsing
		{
			const char*			args[]	= { "-s", "test value", "-b", "-i=9", "--named=huge" };
			CommandLine			cmdLine;
			std::ostringstream	err;
			bool				parseOk	= parser.parse(DE_LENGTH_OF_ARRAY(args), &args[0], &cmdLine, err);

			DE_TEST_ASSERT(parseOk);
			DE_TEST_ASSERT(err.str().empty());

			DE_TEST_ASSERT(cmdLine.getOption<TestStringOpt>() == "test value");
			DE_TEST_ASSERT(cmdLine.getOption<TestIntOpt>() == 9);
			DE_TEST_ASSERT(cmdLine.getOption<TestBoolOpt>());
			DE_TEST_ASSERT(cmdLine.getOption<TestNamedOpt>() == ~0ull);
			DE_TEST_ASSERT(cmdLine.getOption<TestStringDefOpt>() == "foo");
		}

		// End of argument list (--)
		{
			const char*			args[]	= { "--string=foo", "-b", "--", "--int=2", "-b" };
			CommandLine			cmdLine;
			std::ostringstream	err;
			bool				parseOk	= parser.parse(DE_LENGTH_OF_ARRAY(args), &args[0], &cmdLine, err);

			DE_TEST_ASSERT(parseOk);
			DE_TEST_ASSERT(err.str().empty());

			DE_TEST_ASSERT(cmdLine.getOption<TestStringOpt>() == "foo");
			DE_TEST_ASSERT(cmdLine.getOption<TestBoolOpt>());
			DE_TEST_ASSERT(!cmdLine.hasOption<TestIntOpt>());

			DE_TEST_ASSERT(cmdLine.getArgs().size() == 2);
			DE_TEST_ASSERT(cmdLine.getArgs()[0] == "--int=2");
			DE_TEST_ASSERT(cmdLine.getArgs()[1] == "-b");
		}

		// Value --
		{
			const char*			args[]	= { "--string", "--", "-b", "foo" };
			CommandLine			cmdLine;
			std::ostringstream	err;
			bool				parseOk	= parser.parse(DE_LENGTH_OF_ARRAY(args), &args[0], &cmdLine, err);

			DE_TEST_ASSERT(parseOk);
			DE_TEST_ASSERT(err.str().empty());

			DE_TEST_ASSERT(cmdLine.getOption<TestStringOpt>() == "--");
			DE_TEST_ASSERT(cmdLine.getOption<TestBoolOpt>());
			DE_TEST_ASSERT(!cmdLine.hasOption<TestIntOpt>());

			DE_TEST_ASSERT(cmdLine.getArgs().size() == 1);
			DE_TEST_ASSERT(cmdLine.getArgs()[0] == "foo");
		}

		// Invalid flag usage
		{
			const char*			args[]	= { "-b=true" };
			CommandLine			cmdLine;
			std::ostringstream	err;
			bool				parseOk	= parser.parse(DE_LENGTH_OF_ARRAY(args), &args[0], &cmdLine, err);

			DE_TEST_ASSERT(!parseOk);
			DE_TEST_ASSERT(!err.str().empty());
		}

		// Invalid named option
		{
			const char*			args[]	= { "-n=two" };
			CommandLine			cmdLine;
			std::ostringstream	err;
			bool				parseOk	= parser.parse(DE_LENGTH_OF_ARRAY(args), &args[0], &cmdLine, err);

			DE_TEST_ASSERT(!parseOk);
			DE_TEST_ASSERT(!err.str().empty());
		}

		// Unrecognized option (-x)
		{
			const char*			args[]	= { "-x" };
			CommandLine			cmdLine;
			std::ostringstream	err;
			bool				parseOk	= parser.parse(DE_LENGTH_OF_ARRAY(args), &args[0], &cmdLine, err);

			DE_TEST_ASSERT(!parseOk);
			DE_TEST_ASSERT(!err.str().empty());
		}

		// Unrecognized option (--xxx)
		{
			const char*			args[]	= { "--xxx" };
			CommandLine			cmdLine;
			std::ostringstream	err;
			bool				parseOk	= parser.parse(DE_LENGTH_OF_ARRAY(args), &args[0], &cmdLine, err);

			DE_TEST_ASSERT(!parseOk);
			DE_TEST_ASSERT(!err.str().empty());
		}

		// Invalid int value
		{
			const char*			args[]	= { "--int", "1x" };
			CommandLine			cmdLine;
			std::ostringstream	err;
			bool				parseOk	= parser.parse(DE_LENGTH_OF_ARRAY(args), &args[0], &cmdLine, err);

			DE_TEST_ASSERT(!parseOk);
			DE_TEST_ASSERT(!err.str().empty());
		}

		// Arg specified multiple times
		{
			const char*			args[]	= { "-s=2", "-s=3" };
			CommandLine			cmdLine;
			std::ostringstream	err;
			bool				parseOk	= parser.parse(DE_LENGTH_OF_ARRAY(args), &args[0], &cmdLine, err);

			DE_TEST_ASSERT(!parseOk);
			DE_TEST_ASSERT(!err.str().empty());
		}

		// Missing value
		{
			const char*			args[]	= { "--int" };
			CommandLine			cmdLine;
			std::ostringstream	err;
			bool				parseOk	= parser.parse(DE_LENGTH_OF_ARRAY(args), &args[0], &cmdLine, err);

			DE_TEST_ASSERT(!parseOk);
			DE_TEST_ASSERT(!err.str().empty());
		}

		// Empty value --arg=
		{
			const char*			args[]	= { "--string=", "-b", "-x", "" };
			CommandLine			cmdLine;
			std::ostringstream	err;
			bool				parseOk	= parser.parse(DE_LENGTH_OF_ARRAY(args), &args[0], &cmdLine, err);

			DE_TEST_ASSERT(parseOk);
			DE_TEST_ASSERT(err.str().empty());
			DE_TEST_ASSERT(cmdLine.getOption<TestStringOpt>() == "");
			DE_TEST_ASSERT(cmdLine.getOption<TestStringDefOpt>() == "");
			DE_TEST_ASSERT(cmdLine.getOption<TestBoolOpt>());
		}
	}
}